

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O3

void __thiscall SSD1306::FileDescriptor::FileDescriptor(FileDescriptor *this,FileDescriptor *rhs)

{
  undefined8 uVar1;
  
  this->fd_ = rhs->fd_;
  *(undefined8 *)&(this->close_if_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->close_if_).super__Function_base._M_functor + 8) = 0;
  (this->close_if_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->close_if_)._M_invoker = (rhs->close_if_)._M_invoker;
  if ((rhs->close_if_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->close_if_).super__Function_base._M_functor =
         *(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->close_if_).super__Function_base._M_functor + 8) = uVar1;
    (this->close_if_).super__Function_base._M_manager =
         (rhs->close_if_).super__Function_base._M_manager;
  }
  rhs->fd_ = -1;
  *(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8) = 0;
  (rhs->close_if_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_manager;
  (rhs->close_if_)._M_invoker =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:62:21)>
       ::_M_invoke;
  return;
}

Assistant:

SSD1306::FileDescriptor::FileDescriptor(
    SSD1306::FileDescriptor&& rhs)
:
    fd_{rhs.fd_},
    close_if_{std::move(rhs.close_if_)}
{
    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };
}